

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O3

void btreeblk_discard_blocks(btreeblk_handle *handle)

{
  list_elem *plVar1;
  list_elem *plVar2;
  list_elem *e;
  
  e = (handle->read_list).head;
  if (e != (list_elem *)0x0) {
    do {
      plVar1 = e->next;
      list_remove(&handle->read_list,e);
      plVar2 = e[2].next;
      if (plVar2 != (list_elem *)0x0) {
        plVar2->prev = e[-1].next;
        list_push_front(&handle->blockpool,(list_elem *)&plVar2->next);
      }
      free(e + -2);
      e = plVar1;
    } while (plVar1 != (list_elem *)0x0);
  }
  return;
}

Assistant:

void btreeblk_discard_blocks(struct btreeblk_handle *handle)
{
    // discard all writable blocks in the read list
    struct list_elem *e;
    struct btreeblk_block *block;

    // free items in read list
    // list
    e = list_begin(&handle->read_list);
    while(e){
        block = _get_entry(e, struct btreeblk_block, le);
        e = list_next(&block->le);

        list_remove(&handle->read_list, &block->le);
        _btreeblk_free_dirty_block(handle, block);
    }
}